

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

TCGArg do_constant_folding_cond(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y,TCGCond c)

{
  char *pcVar1;
  byte *pbVar2;
  bool bVar3;
  _Bool _Var4;
  TCGArg TVar5;
  ulong y_00;
  TCGArgConstraint TVar6;
  uint64_t extraout_RDX;
  TCGArgConstraint TVar7;
  uint uVar8;
  TCGArgConstraint y_01;
  uint uVar9;
  uint64_t x_00;
  TCGCond c_00;
  uint64_t uVar10;
  
  pcVar1 = *(char **)(x + 0x30);
  pbVar2 = *(byte **)(y + 0x30);
  y_01 = *(TCGArgConstraint *)(pbVar2 + 0x18);
  if ((*pcVar1 != '\x01') || (*pbVar2 != 1)) {
    if (x != y) {
      TVar5 = *(TCGArg *)(pcVar1 + 0x10);
      if ((TVar5 != x) && (*(TCGArg *)(pbVar2 + 0x10) != y)) {
        do {
          if (TVar5 == y) goto LAB_00d4a8e5;
          TVar5 = *(TCGArg *)(*(long *)(TVar5 + 0x30) + 0x10);
        } while (TVar5 != x);
      }
      if ((y_01 == (TCGArgConstraint)0x0 & *pbVar2) != 1) {
        return 2;
      }
      if (c == TCG_COND_LTU) {
        return 0;
      }
      return (ulong)(c != TCG_COND_GEU) + 1;
    }
LAB_00d4a8e5:
    bVar3 = do_constant_folding_cond_eq(c);
    goto LAB_00d4a942;
  }
  x_00 = *(uint64_t *)(pcVar1 + 0x18);
  TVar6 = (TCGArgConstraint)s->tcg_op_defs;
  if ((((uint8_t *)((long)TVar6 + 0xc))[(ulong)op * 0x20] & 0x10) != 0) {
    bVar3 = do_constant_folding_cond_64(x_00,(uint64_t)y_01,c);
    goto LAB_00d4a942;
  }
  c_00 = c - TCG_COND_LT;
  if (c_00 < TCG_COND_LEU) {
    TVar6 = (TCGArgConstraint)
            ((long)&switchD_00d4a8d7::switchdataD_00dca130 +
            (long)(int)(&switchD_00d4a8d7::switchdataD_00dca130)[c_00]);
    uVar8 = y_01._0_4_;
    uVar9 = (uint)x_00;
    switch(c_00) {
    case TCG_COND_NEVER:
      bVar3 = (int)uVar9 < (int)uVar8;
      break;
    case TCG_COND_ALWAYS:
      bVar3 = (int)uVar8 <= (int)uVar9;
      break;
    case TCG_COND_LT:
      bVar3 = uVar9 < uVar8;
      break;
    case TCG_COND_GE:
      bVar3 = uVar8 <= uVar9;
      break;
    default:
      goto switchD_00d4a8d7_caseD_4;
    case TCG_COND_LTU|TCG_COND_LT:
      bVar3 = uVar9 == uVar8;
      break;
    case TCG_COND_LTU|TCG_COND_GE:
      bVar3 = uVar9 != uVar8;
      break;
    case TCG_COND_EQ:
      bVar3 = (int)uVar9 <= (int)uVar8;
      break;
    case TCG_COND_NE:
      bVar3 = (int)uVar8 < (int)uVar9;
      break;
    case TCG_COND_LE:
      bVar3 = uVar9 <= uVar8;
      break;
    case TCG_COND_GT:
      bVar3 = uVar8 < uVar9;
    }
LAB_00d4a942:
    return (ulong)bVar3;
  }
switchD_00d4a8d7_caseD_4:
  do_constant_folding_cond_cold_1();
  pcVar1 = *(char **)(extraout_RDX + 0x30);
  if ((*pcVar1 == '\x01') && ((char)(*(TCGArgConstraint **)((long)TVar6 + 0x30))->ct == '\x01')) {
    y_00 = (long)(*(TCGArgConstraint **)((long)TVar6 + 0x30))[3] << 0x20 |
           (ulong)*(uint *)(pcVar1 + 0x18);
    if ((**(char **)(x_00 + 0x30) == '\x01') && (**(char **)((long)y_01 + 0x30) == '\x01')) {
      _Var4 = do_constant_folding_cond_64
                        (*(long *)(*(char **)((long)y_01 + 0x30) + 0x18) << 0x20 |
                         (ulong)*(uint *)(*(char **)(x_00 + 0x30) + 0x18),y_00,c_00);
      goto LAB_00d4a9f5;
    }
    if (y_00 == 0) {
      if (c_00 == TCG_COND_LTU) {
        return 0;
      }
      if (c_00 == TCG_COND_GEU) {
        return 1;
      }
    }
  }
  if (x_00 != extraout_RDX) {
    uVar10 = *(uint64_t *)(*(long *)(x_00 + 0x30) + 0x10);
    if (uVar10 == x_00) {
      return 2;
    }
    if (*(uint64_t *)(pcVar1 + 0x10) == extraout_RDX) {
      return 2;
    }
    while (uVar10 != extraout_RDX) {
      uVar10 = *(uint64_t *)(*(long *)(uVar10 + 0x30) + 0x10);
      if (uVar10 == x_00) {
        return 2;
      }
    }
  }
  if (y_01 != TVar6) {
    TVar7 = *(TCGArgConstraint *)(*(long *)((long)y_01 + 0x30) + 0x10);
    if (TVar7 == y_01) {
      return 2;
    }
    if ((*(TCGArgConstraint **)((long)TVar6 + 0x30))[2] == TVar6) {
      return 2;
    }
    while (TVar7 != TVar6) {
      TVar7 = *(TCGArgConstraint *)(*(long *)((long)TVar7 + 0x30) + 0x10);
      if (TVar7 == y_01) {
        return 2;
      }
    }
  }
  _Var4 = do_constant_folding_cond_eq(c_00);
LAB_00d4a9f5:
  return (ulong)_Var4;
}

Assistant:

static TCGArg do_constant_folding_cond(TCGContext *s, TCGOpcode op, TCGArg x,
                                       TCGArg y, TCGCond c)
{
    tcg_target_ulong xv = arg_info(x)->val;
    tcg_target_ulong yv = arg_info(y)->val;
    if (arg_is_const(x) && arg_is_const(y)) {
        const TCGOpDef *def = &s->tcg_op_defs[op];
        tcg_debug_assert(!(def->flags & TCG_OPF_VECTOR));
        if (def->flags & TCG_OPF_64BIT) {
            return do_constant_folding_cond_64(xv, yv, c);
        } else {
            return do_constant_folding_cond_32(xv, yv, c);
        }
    } else if (args_are_copies(x, y)) {
        return do_constant_folding_cond_eq(c);
    } else if (arg_is_const(y) && yv == 0) {
        switch (c) {
        case TCG_COND_LTU:
            return 0;
        case TCG_COND_GEU:
            return 1;
        default:
            return 2;
        }
    }
    return 2;
}